

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_reader.hpp
# Opt level: O2

ptrdiff_t __thiscall
pstore::http::
buffered_reader<int,_std::function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>_>
::pos(buffered_reader<int,_std::function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>_>
      *this,iterator *s)

{
  bool bVar1;
  difference_type dVar2;
  span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> sStack_38;
  span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> local_28;
  
  pstore::gsl::span<unsigned_char,_-1L>::begin((span<unsigned_char,__1L> *)&sStack_38);
  bVar1 = pstore::gsl::details::operator>=(s,&sStack_38);
  if (bVar1) {
    pstore::gsl::span<unsigned_char,_-1L>::end((span<unsigned_char,__1L> *)&local_28);
    bVar1 = pstore::gsl::details::operator<=(s,&local_28);
    if (bVar1) {
      pstore::gsl::span<unsigned_char,_-1L>::begin((span<unsigned_char,__1L> *)&sStack_38);
      dVar2 = pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::
              operator-(s,&sStack_38);
      return dVar2;
    }
  }
  assert_failed("s >= span_.begin () && s <= span_.end ()",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/http/buffered_reader.hpp"
                ,0x82);
}

Assistant:

std::ptrdiff_t pos (gsl::span<std::uint8_t>::iterator const & s) noexcept {
                PSTORE_ASSERT (s >= span_.begin () && s <= span_.end ());
                return s - span_.begin ();
            }